

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O2

offset_t __thiscall ImportedFuncWrapper::getFieldRVA(ImportedFuncWrapper *this,FieldID fId)

{
  ExeNodeWrapper *pEVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  bufsize_t bVar4;
  long lVar5;
  bool isOk;
  
  if ((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode ==
      (ExeNodeWrapper *)0x0) {
    return 0;
  }
  bVar2 = ExeElementWrapper::isBit32((ExeElementWrapper *)this);
  pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode;
  iVar3 = (*(pEVar1->super_ExeElementWrapper).super_AbstractByteBuffer._vptr_AbstractByteBuffer
            [0x1c])(pEVar1,(long)fId,0xffffffffffffffff,&isOk);
  if (isOk == true) {
    lVar5 = (long)iVar3;
    if (!bVar2) {
      lVar5 = CONCAT44(extraout_var,iVar3);
    }
    if (1 < lVar5 + 1U) {
      bVar4 = ImportBaseFuncWrapper::getAddrSize(&this->super_ImportBaseFuncWrapper);
      return bVar4 * (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                     entryNum + lVar5;
    }
  }
  return 0;
}

Assistant:

offset_t ImportedFuncWrapper::getFieldRVA(ImportEntryWrapper::FieldID fId)
{
    if (!parentNode) return 0;
    bool is32 = isBit32();

    bool isOk;
    uint64_t thunkRva = parentNode->getNumValue(fId, &isOk);
    if (!isOk) return 0; //TODO

    if (is32) thunkRva = (int32_t)(thunkRva);
    if (thunkRva == 0 ||  thunkRva == (-1)) return 0; //TODO

    size_t thunkValSize = this->getThunkValSize();
    offset_t offset = this->entryNum * thunkValSize;

    offset_t fieldRVA = thunkRva + offset;
    return fieldRVA;
}